

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

size_t nlohmann::detail::
       binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
       ::calc_bson_element_size
                 (string_t *name,
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *j)

{
  value_t vVar1;
  size_t sVar2;
  size_t header_size;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *j_local;
  string_t *name_local;
  
  name_local = (string_t *)calc_bson_entry_header_size(name,j);
  vVar1 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::type(j);
  switch(vVar1) {
  case null:
    break;
  case object:
    sVar2 = calc_bson_object_size((j->m_value).object);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case array:
    sVar2 = calc_bson_array_size((j->m_value).array);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case string:
    sVar2 = calc_bson_string_size((string_t *)(j->m_value).object);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case boolean:
    name_local = (string_t *)&name_local->field_0x1;
    break;
  case number_integer:
    sVar2 = calc_bson_integer_size((j->m_value).number_integer);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case number_unsigned:
    sVar2 = calc_bson_unsigned_size((j->m_value).number_unsigned);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case number_float:
    name_local = (string_t *)&name_local->_M_string_length;
    break;
  case binary:
    sVar2 = calc_bson_binary_size((j->m_value).binary);
    name_local = (string_t *)(&name_local->_M_dataplus + sVar2);
    break;
  case discarded:
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/vijaiaeroastro[P]nastranToJson/include/json.hpp"
                  ,0x399b,
                  "static std::size_t nlohmann::detail::binary_writer<nlohmann::basic_json<>, unsigned char>::calc_bson_element_size(const string_t &, const BasicJsonType &) [BasicJsonType = nlohmann::basic_json<>, CharType = unsigned char]"
                 );
  }
  return (size_t)name_local;
}

Assistant:

static std::size_t calc_bson_element_size(const string_t& name,
            const BasicJsonType& j)
    {
        const auto header_size = calc_bson_entry_header_size(name, j);
        switch (j.type())
        {
            case value_t::object:
                return header_size + calc_bson_object_size(*j.m_value.object);

            case value_t::array:
                return header_size + calc_bson_array_size(*j.m_value.array);

            case value_t::binary:
                return header_size + calc_bson_binary_size(*j.m_value.binary);

            case value_t::boolean:
                return header_size + 1ul;

            case value_t::number_float:
                return header_size + 8ul;

            case value_t::number_integer:
                return header_size + calc_bson_integer_size(j.m_value.number_integer);

            case value_t::number_unsigned:
                return header_size + calc_bson_unsigned_size(j.m_value.number_unsigned);

            case value_t::string:
                return header_size + calc_bson_string_size(*j.m_value.string);

            case value_t::null:
                return header_size + 0ul;

            // LCOV_EXCL_START
            case value_t::discarded:
            default:
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert)
                return 0ul;
                // LCOV_EXCL_STOP
        }
    }